

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorSpeed::ConstraintsBiLoad_C
          (ChShaftsMotorSpeed *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar4 [64];
  
  auVar4._8_56_ = in_register_00001248;
  auVar4._0_8_ = recovery_clamp;
  dVar2 = 0.0;
  if (this->avoid_angle_drift == true) {
    (*(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
      _vptr_ChObj[0x40])(this);
    dVar2 = (dVar2 - this->aux_dt) - this->rot_offset;
  }
  dVar2 = dVar2 * factor;
  if (do_clamp) {
    auVar1._8_8_ = 0x8000000000000000;
    auVar1._0_8_ = 0x8000000000000000;
    auVar1 = vxorpd_avx512vl(auVar4._0_16_,auVar1);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar2;
    auVar1 = vmaxsd_avx(auVar3,auVar1);
    auVar1 = vminsd_avx(auVar1,auVar4._0_16_);
    dVar2 = auVar1._0_8_;
  }
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i =
       dVar2 + (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i;
  return;
}

Assistant:

void ChShaftsMotorSpeed::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {

    double C;
    if (this->avoid_angle_drift) 
        C = this->GetMotorRot()  - aux_dt - this->rot_offset; 
    else
        C = 0.0;

    double res = factor * C;

    if (do_clamp) {
        res = ChMin(ChMax(res, -recovery_clamp), recovery_clamp);
    }

    constraint.Set_b_i(constraint.Get_b_i() + res);
}